

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O1

void google::protobuf::json_internal::ParseProto3Type::
     SetInt<unsigned_long,(google::protobuf::Field_Kind)4,(google::protobuf::Field_Kind)6,(google::protobuf::Field_Kind)0>
               (Field f,Msg *msg,unsigned_long x)

{
  int iVar1;
  Field *pFVar2;
  bool bVar3;
  byte *pbVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  RecordAsSeen(f,msg);
  pFVar2 = f->raw_;
  iVar1 = (pFVar2->field_0)._impl_.kind_;
  if (iVar1 == 6) {
    iVar1 = (pFVar2->field_0)._impl_.number_;
    pbVar4 = (msg->stream_).cur_;
    if ((msg->stream_).impl_.end_ <= pbVar4) {
      pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,pbVar4);
    }
    uVar6 = (ulong)(iVar1 * 8 + 1);
    (msg->stream_).cur_ = pbVar4;
    if (0x7f < (uint)(iVar1 << 3)) {
      do {
        uVar7 = (uint)uVar6;
        *pbVar4 = (byte)uVar6 | 0x80;
        uVar6 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
      } while (0x3fff < uVar7);
    }
    *pbVar4 = (byte)uVar6;
    puVar5 = (unsigned_long *)(pbVar4 + 1);
    (msg->stream_).cur_ = (uint8_t *)puVar5;
    if ((msg->stream_).impl_.end_ <= puVar5) {
      puVar5 = (unsigned_long *)
               io::EpsCopyOutputStream::EnsureSpaceFallback
                         ((EpsCopyOutputStream *)msg,(uint8_t *)puVar5);
    }
    (msg->stream_).cur_ = (uint8_t *)puVar5;
    *puVar5 = x;
    puVar5 = puVar5 + 1;
  }
  else {
    if (iVar1 != 4) {
      if (iVar1 != 0) {
        return;
      }
      x = (long)x >> 0x3f ^ x * 2;
    }
    uVar7 = (pFVar2->field_0)._impl_.number_ << 3;
    pbVar4 = (msg->stream_).cur_;
    if ((msg->stream_).impl_.end_ <= pbVar4) {
      pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,pbVar4);
    }
    (msg->stream_).cur_ = pbVar4;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar4 = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar3);
    }
    *pbVar4 = (byte)uVar7;
    pbVar4 = pbVar4 + 1;
    (msg->stream_).cur_ = pbVar4;
    if ((msg->stream_).impl_.end_ <= pbVar4) {
      pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,pbVar4);
    }
    (msg->stream_).cur_ = pbVar4;
    uVar6 = x;
    if (0x7f < x) {
      do {
        *pbVar4 = (byte)uVar6 | 0x80;
        x = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = x;
      } while (bVar3);
    }
    *pbVar4 = (byte)x;
    puVar5 = (unsigned_long *)(pbVar4 + 1);
  }
  (msg->stream_).cur_ = (uint8_t *)puVar5;
  return;
}

Assistant:

static void SetInt(Field f, Msg& msg, Int x) {
    RecordAsSeen(f, msg);
    switch (f->proto().kind()) {
      case zigzag:
        // Regardless of the integer type, ZigZag64 will do the right thing,
        // because ZigZag is not dependent on the width of the integer: it is
        // always `2 * abs(n) + (n < 0)`.
        x = static_cast<Int>(
            internal::WireFormatLite::ZigZagEncode64(static_cast<int64_t>(x)));
        ABSL_FALLTHROUGH_INTENDED;
      case varint:
        msg.stream_.WriteTag(f->proto().number() << 3 |
                             WireFormatLite::WIRETYPE_VARINT);
        if (sizeof(Int) == 4) {
          msg.stream_.WriteVarint32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteVarint64(static_cast<uint64_t>(x));
        }
        break;
      case fixed: {
        if (sizeof(Int) == 4) {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED32);
          msg.stream_.WriteLittleEndian32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED64);
          msg.stream_.WriteLittleEndian64(static_cast<uint64_t>(x));
        }
        break;
      }
      default: {  // Unreachable.
      }
    }
  }